

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O3

void dradb3(int ido,int l1,float *cc,float *ch,float *wa1,float *wa2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (0 < l1) {
    iVar2 = l1 * ido;
    iVar5 = iVar2 * 2;
    iVar7 = ido * 2;
    iVar1 = ido * 3;
    lVar10 = (long)ido;
    pfVar9 = cc;
    pfVar4 = ch;
    iVar3 = l1;
    do {
      fVar11 = pfVar9[(long)iVar7 + -1] + pfVar9[(long)iVar7 + -1];
      fVar12 = fVar11 * -0.5 + *pfVar9;
      *pfVar4 = fVar11 + *pfVar9;
      fVar11 = (pfVar9[iVar7] + pfVar9[iVar7]) * 0.8660254;
      pfVar4[iVar2] = fVar12 - fVar11;
      pfVar4[iVar5] = fVar11 + fVar12;
      pfVar9 = pfVar9 + iVar1;
      pfVar4 = pfVar4 + lVar10;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    if (ido != 1 && 0 < l1) {
      iVar3 = 0;
      iVar8 = 0;
      pfVar9 = ch;
      do {
        if (2 < ido) {
          pfVar4 = cc + (long)iVar7 + -2;
          lVar6 = 2;
          do {
            fVar13 = (cc[(long)iVar7 + lVar6 + -1] + pfVar4[-1]) * -0.5 +
                     cc[(long)iVar3 + lVar6 + -1];
            pfVar9[lVar6 + -1] =
                 cc[(long)iVar7 + lVar6 + -1] + pfVar4[-1] + cc[(long)iVar3 + lVar6 + -1];
            fVar11 = (cc[iVar7 + lVar6] - *pfVar4) * -0.5 + cc[iVar3 + lVar6];
            pfVar9[lVar6] = (cc[iVar7 + lVar6] - *pfVar4) + cc[iVar3 + lVar6];
            fVar14 = (cc[(long)iVar7 + lVar6 + -1] - pfVar4[-1]) * 0.8660254;
            fVar12 = (cc[iVar7 + lVar6] + *pfVar4) * 0.8660254;
            fVar15 = fVar13 - fVar12;
            fVar12 = fVar12 + fVar13;
            fVar13 = fVar11 + fVar14;
            fVar11 = fVar11 - fVar14;
            ch[(long)iVar2 + lVar6 + -1] = wa1[lVar6 + -2] * fVar15 - wa1[lVar6 + -1] * fVar13;
            ch[iVar2 + lVar6] = fVar13 * wa1[lVar6 + -2] + fVar15 * wa1[lVar6 + -1];
            ch[(long)iVar5 + lVar6 + -1] = wa2[lVar6 + -2] * fVar12 - wa2[lVar6 + -1] * fVar11;
            ch[iVar5 + lVar6] = fVar11 * wa2[lVar6 + -2] + fVar12 * wa2[lVar6 + -1];
            lVar6 = lVar6 + 2;
            pfVar4 = pfVar4 + -2;
          } while (lVar6 < lVar10);
        }
        iVar8 = iVar8 + 1;
        iVar7 = iVar7 + iVar1;
        iVar3 = iVar3 + iVar1;
        iVar5 = iVar5 + ido;
        iVar2 = iVar2 + ido;
        pfVar9 = pfVar9 + lVar10;
      } while (iVar8 != l1);
    }
  }
  return;
}

Assistant:

static void dradb3(int ido,int l1,float *cc,float *ch,float *wa1,
                          float *wa2){
  static float taur = -.5f;
  static float taui = .8660254037844386f;
  int i,k,t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10;
  float ci2,ci3,di2,di3,cr2,cr3,dr2,dr3,ti2,tr2;
  t0=l1*ido;

  t1=0;
  t2=t0<<1;
  t3=ido<<1;
  t4=ido+(ido<<1);
  t5=0;
  for(k=0;k<l1;k++){
    tr2=cc[t3-1]+cc[t3-1];
    cr2=cc[t5]+(taur*tr2);
    ch[t1]=cc[t5]+tr2;
    ci3=taui*(cc[t3]+cc[t3]);
    ch[t1+t0]=cr2-ci3;
    ch[t1+t2]=cr2+ci3;
    t1+=ido;
    t3+=t4;
    t5+=t4;
  }

  if(ido==1)return;

  t1=0;
  t3=ido<<1;
  for(k=0;k<l1;k++){
    t7=t1+(t1<<1);
    t6=(t5=t7+t3);
    t8=t1;
    t10=(t9=t1+t0)+t0;

    for(i=2;i<ido;i+=2){
      t5+=2;
      t6-=2;
      t7+=2;
      t8+=2;
      t9+=2;
      t10+=2;
      tr2=cc[t5-1]+cc[t6-1];
      cr2=cc[t7-1]+(taur*tr2);
      ch[t8-1]=cc[t7-1]+tr2;
      ti2=cc[t5]-cc[t6];
      ci2=cc[t7]+(taur*ti2);
      ch[t8]=cc[t7]+ti2;
      cr3=taui*(cc[t5-1]-cc[t6-1]);
      ci3=taui*(cc[t5]+cc[t6]);
      dr2=cr2-ci3;
      dr3=cr2+ci3;
      di2=ci2+cr3;
      di3=ci2-cr3;
      ch[t9-1]=wa1[i-2]*dr2-wa1[i-1]*di2;
      ch[t9]=wa1[i-2]*di2+wa1[i-1]*dr2;
      ch[t10-1]=wa2[i-2]*dr3-wa2[i-1]*di3;
      ch[t10]=wa2[i-2]*di3+wa2[i-1]*dr3;
    }
    t1+=ido;
  }
}